

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O0

void av1_loop_filter_frame_init(AV1_COMMON *cm,int plane_start,int plane_end)

{
  SEG_LVL_FEATURES feature_id;
  int iVar1;
  int iVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int inter_lvl;
  int intra_lvl;
  int scale;
  int mode;
  int ref;
  int data;
  int seg_lf_feature_id;
  int lvl_seg;
  int dir;
  segmentation *seg;
  loopfilter *lf;
  loop_filter_info_n *lfi;
  int seg_id;
  int plane;
  int filt_lvl_r [3];
  int filt_lvl [3];
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int local_60;
  int local_5c;
  uint local_50;
  int local_4c;
  int local_30;
  int local_2c;
  uint local_28 [4];
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  update_sharpness((loop_filter_info_n *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff8c);
  local_28[3] = *(int *)(local_8 + 0x59f0);
  local_18 = *(int *)(local_8 + 0x59f8);
  local_14 = *(int *)(local_8 + 0x59fc);
  local_28[0] = *(uint *)(local_8 + 0x59f4);
  local_28[1] = *(undefined4 *)(local_8 + 0x59f8);
  local_28[2] = *(undefined4 *)(local_8 + 0x59fc);
  local_2c = local_c;
  while ((local_2c < local_10 && (((local_2c != 0 || (local_28[3] != 0)) || (local_28[0] != 0))))) {
    if (((local_2c != 1) || (local_18 != 0)) && ((local_2c != 2 || (local_14 != 0)))) {
      for (local_30 = 0; local_30 < 8; local_30 = local_30 + 1) {
        for (local_4c = 0; local_4c < 2; local_4c = local_4c + 1) {
          if (local_4c == 0) {
            local_50 = local_28[(long)local_2c + 3];
          }
          else {
            local_50 = local_28[local_2c];
          }
          feature_id = seg_lvl_lf_lut[local_2c][local_4c];
          iVar1 = segfeature_active((segmentation *)(in_RDI + 19000),(uint8_t)local_30,feature_id);
          if (iVar1 != 0) {
            iVar1 = get_segdata((segmentation *)(local_8 + 19000),local_30,feature_id);
            local_50 = clamp(local_50 + iVar1,0,0x3f);
          }
          if (*(char *)(in_RDI + 0x5a14) == '\0') {
            memset((void *)(in_RDI + 0x56f0 + (long)local_2c * 0x100 + (long)local_30 * 0x20 +
                           (long)local_4c * 0x10),local_50 & 0xff,0x10);
          }
          else {
            iVar1 = 1 << ((byte)((int)local_50 >> 5) & 0x1f);
            iVar2 = clamp(local_50 + *(char *)(in_RDI + 0x5a16) * iVar1,0,0x3f);
            *(char *)(in_RDI + 0x56f0 + (long)local_2c * 0x100 + (long)local_30 * 0x20 +
                     (long)local_4c * 0x10) = (char)iVar2;
            for (local_5c = 1; local_5c < 8; local_5c = local_5c + 1) {
              for (local_60 = 0; local_60 < 2; local_60 = local_60 + 1) {
                iVar2 = clamp(local_50 + *(char *)(in_RDI + 0x5a16 + (long)local_5c) * iVar1 +
                              *(char *)(in_RDI + 0x5a1e + (long)local_60) * iVar1,0,0x3f);
                *(char *)(in_RDI + 0x56f0 + (long)local_2c * 0x100 + (long)local_30 * 0x20 +
                          (long)local_4c * 0x10 + (long)local_5c * 2 + (long)local_60) = (char)iVar2
                ;
              }
            }
          }
        }
      }
    }
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void av1_loop_filter_frame_init(AV1_COMMON *cm, int plane_start,
                                int plane_end) {
  int filt_lvl[MAX_MB_PLANE], filt_lvl_r[MAX_MB_PLANE];
  int plane;
  int seg_id;
  // n_shift is the multiplier for lf_deltas
  // the multiplier is 1 for when filter_lvl is between 0 and 31;
  // 2 when filter_lvl is between 32 and 63
  loop_filter_info_n *const lfi = &cm->lf_info;
  struct loopfilter *const lf = &cm->lf;
  const struct segmentation *const seg = &cm->seg;

  // update sharpness limits
  update_sharpness(lfi, lf->sharpness_level);

  filt_lvl[0] = cm->lf.filter_level[0];
  filt_lvl[1] = cm->lf.filter_level_u;
  filt_lvl[2] = cm->lf.filter_level_v;

  filt_lvl_r[0] = cm->lf.filter_level[1];
  filt_lvl_r[1] = cm->lf.filter_level_u;
  filt_lvl_r[2] = cm->lf.filter_level_v;

  assert(plane_start >= AOM_PLANE_Y);
  assert(plane_end <= MAX_MB_PLANE);

  for (plane = plane_start; plane < plane_end; plane++) {
    if (plane == 0 && !filt_lvl[0] && !filt_lvl_r[0])
      break;
    else if (plane == 1 && !filt_lvl[1])
      continue;
    else if (plane == 2 && !filt_lvl[2])
      continue;

    for (seg_id = 0; seg_id < MAX_SEGMENTS; seg_id++) {
      for (int dir = 0; dir < 2; ++dir) {
        int lvl_seg = (dir == 0) ? filt_lvl[plane] : filt_lvl_r[plane];
        const int seg_lf_feature_id = seg_lvl_lf_lut[plane][dir];
        if (segfeature_active(seg, seg_id, seg_lf_feature_id)) {
          const int data = get_segdata(&cm->seg, seg_id, seg_lf_feature_id);
          lvl_seg = clamp(lvl_seg + data, 0, MAX_LOOP_FILTER);
        }

        if (!lf->mode_ref_delta_enabled) {
          // we could get rid of this if we assume that deltas are set to
          // zero when not in use; encoder always uses deltas
          memset(lfi->lvl[plane][seg_id][dir], lvl_seg,
                 sizeof(lfi->lvl[plane][seg_id][dir]));
        } else {
          int ref, mode;
          const int scale = 1 << (lvl_seg >> 5);
          const int intra_lvl = lvl_seg + lf->ref_deltas[INTRA_FRAME] * scale;
          lfi->lvl[plane][seg_id][dir][INTRA_FRAME][0] =
              clamp(intra_lvl, 0, MAX_LOOP_FILTER);

          for (ref = LAST_FRAME; ref < REF_FRAMES; ++ref) {
            for (mode = 0; mode < MAX_MODE_LF_DELTAS; ++mode) {
              const int inter_lvl = lvl_seg + lf->ref_deltas[ref] * scale +
                                    lf->mode_deltas[mode] * scale;
              lfi->lvl[plane][seg_id][dir][ref][mode] =
                  clamp(inter_lvl, 0, MAX_LOOP_FILTER);
            }
          }
        }
      }
    }
  }
}